

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_uefitool.cpp
# Opt level: O1

int __thiscall UEFITool::qt_metacall(UEFITool *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  
  _id_00 = QMainWindow::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id_00 < 0x2b) {
      if (_id_00 == 1) {
        puVar1 = (undefined8 *)*_a;
        if (*_a[1] == 0) {
          *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
          goto LAB_00124a43;
        }
      }
      else {
        puVar1 = (undefined8 *)*_a;
      }
      *puVar1 = 0;
    }
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (_id_00 < 0x2b) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
  }
LAB_00124a43:
  return _id_00 + -0x2b;
}

Assistant:

int UEFITool::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QMainWindow::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 43)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 43;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 43)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 43;
    }
    return _id;
}